

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyHttpImplPrivate::emitReplyUploadProgress
          (QNetworkReplyHttpImplPrivate *this,qint64 bytesSent,qint64 bytesTotal)

{
  QNetworkReply *this_00;
  long lVar1;
  char cVar2;
  
  if ((this->super_QNetworkReplyPrivate).isFinished != false) {
    return;
  }
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  setupTransferTimeout(this);
  if ((this->super_QNetworkReplyPrivate).emitAllUploadProgressSignals == false) {
    cVar2 = QElapsedTimer::isValid();
    if ((bytesSent != bytesTotal && cVar2 == '\x01') &&
       (lVar1 = QElapsedTimer::elapsed(), lVar1 < 100)) {
      return;
    }
    QElapsedTimer::start();
  }
  QNetworkReply::uploadProgress(this_00,bytesSent,bytesTotal);
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::emitReplyUploadProgress(qint64 bytesSent, qint64 bytesTotal)
{
    Q_Q(QNetworkReplyHttpImpl);
    if (isFinished)
        return;

    setupTransferTimeout();

    if (!emitAllUploadProgressSignals) {
        //choke signal emissions, except the first and last signals which are unconditional
        if (uploadProgressSignalChoke.isValid()) {
            if (bytesSent != bytesTotal && uploadProgressSignalChoke.elapsed() < progressSignalInterval) {
                return;
            }
        }
        uploadProgressSignalChoke.start();
    }
    emit q->uploadProgress(bytesSent, bytesTotal);
}